

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

l_mem singlestep(lua_State *L,int fast)

{
  int iVar1;
  global_State *g;
  GCObject *o;
  global_State *pgVar2;
  l_mem lVar3;
  GCObject **ppGVar4;
  int iVar5;
  GCObject **old;
  long lVar6;
  
  g = L->l_G;
  g->gcstopem = '\x01';
  lVar3 = 0;
  switch(g->gcstate) {
  case '\0':
    if ((fast != 0) || (g->gray == (GCObject *)0x0)) {
      g->gcstate = '\x01';
      goto LAB_0010dc59;
    }
    lVar3 = propagatemark(g);
    break;
  case '\x01':
    atomic(L);
    if ((g->gckind == '\x02') &&
       (lVar6 = g->GCtotalbytes - g->GCdebt,
       lVar3 = luaO_applyparam(g->gcparams[1],lVar6 - g->GCmajorminor), lVar3 < lVar6 - g->GCmarked)
       ) {
      atomic2gen(L,g);
      lVar3 = luaO_applyparam(g->gcparams[0],g->GCmajorminor);
      luaE_setdebt(g,lVar3);
      lVar3 = -1;
    }
    else {
      g->GCmajorminor = g->GCmarked;
      pgVar2 = L->l_G;
      pgVar2->gcstate = '\x03';
      ppGVar4 = &pgVar2->allgc;
      do {
        ppGVar4 = sweeplist(L,ppGVar4,1);
      } while (ppGVar4 == &pgVar2->allgc);
      pgVar2->sweepgc = ppGVar4;
      lVar3 = -2;
    }
    break;
  default:
    goto switchD_0010db27_caseD_2;
  case '\x03':
    ppGVar4 = g->sweepgc;
    if (ppGVar4 == (GCObject **)0x0) {
      ppGVar4 = &g->finobj;
      g->gcstate = '\x04';
    }
    else {
LAB_0010dc99:
      lVar3 = 0x7fffffffffffffff;
      if (fast == 0) {
        lVar3 = 0x14;
      }
      ppGVar4 = sweeplist(L,ppGVar4,lVar3);
    }
    goto LAB_0010dcb9;
  case '\x04':
    ppGVar4 = g->sweepgc;
    if (ppGVar4 != (GCObject **)0x0) goto LAB_0010dc99;
    ppGVar4 = &g->tobefnz;
    g->gcstate = '\x05';
    goto LAB_0010dcb9;
  case '\x05':
    ppGVar4 = g->sweepgc;
    if (ppGVar4 != (GCObject **)0x0) goto LAB_0010dc99;
    g->gcstate = '\x06';
    ppGVar4 = (GCObject **)0x0;
LAB_0010dcb9:
    g->sweepgc = ppGVar4;
LAB_0010dcbd:
    lVar3 = 0x14;
    break;
  case '\x06':
    if (g->gcemergency == '\0') {
      iVar1 = (g->strt).size;
      iVar5 = iVar1 + 3;
      if (-1 < iVar1) {
        iVar5 = iVar1;
      }
      if ((g->strt).nuse < iVar5 >> 2) {
        luaS_resize(L,iVar1 / 2);
      }
    }
    g->gcstate = '\a';
    goto LAB_0010dcbd;
  case '\a':
    if ((g->tobefnz == (GCObject *)0x0) || (g->gcemergency != '\0')) {
      g->gcstate = '\b';
      lVar3 = -3;
    }
    else {
      g->gcstopem = '\0';
      GCTM(L);
      lVar3 = 10;
    }
    break;
  case '\b':
    g->weak = (GCObject *)0x0;
    g->ephemeron = (GCObject *)0x0;
    g->gray = (GCObject *)0x0;
    g->grayagain = (GCObject *)0x0;
    g->allweak = (GCObject *)0x0;
    g->GCmarked = 0;
    if (((g->mainth).l.marked & 0x18) != 0) {
      reallymarkobject(g,(GCObject *)&(g->mainth).l);
    }
    if ((((g->l_registry).tt_ & 0x40) != 0) &&
       (o = (g->l_registry).value_.gc, (o->marked & 0x18) != 0)) {
      reallymarkobject(g,o);
    }
    markmt(g);
    markbeingfnz(g);
    g->gcstate = '\0';
LAB_0010dc59:
    lVar3 = 1;
  }
  g->gcstopem = '\0';
switchD_0010db27_caseD_2:
  return lVar3;
}

Assistant:

static l_mem singlestep (lua_State *L, int fast) {
  global_State *g = G(L);
  l_mem stepresult;
  lua_assert(!g->gcstopem);  /* collector is not reentrant */
  g->gcstopem = 1;  /* no emergency collections while collecting */
  switch (g->gcstate) {
    case GCSpause: {
      restartcollection(g);
      g->gcstate = GCSpropagate;
      stepresult = 1;
      break;
    }
    case GCSpropagate: {
      if (fast || g->gray == NULL) {
        g->gcstate = GCSenteratomic;  /* finish propagate phase */
        stepresult = 1;
      }
      else
        stepresult = propagatemark(g);  /* traverse one gray object */
      break;
    }
    case GCSenteratomic: {
      atomic(L);
      if (checkmajorminor(L, g))
        stepresult = step2minor;
      else {
        entersweep(L);
        stepresult = atomicstep;
      }
      break;
    }
    case GCSswpallgc: {  /* sweep "regular" objects */
      sweepstep(L, g, GCSswpfinobj, &g->finobj, fast);
      stepresult = GCSWEEPMAX;
      break;
    }
    case GCSswpfinobj: {  /* sweep objects with finalizers */
      sweepstep(L, g, GCSswptobefnz, &g->tobefnz, fast);
      stepresult = GCSWEEPMAX;
      break;
    }
    case GCSswptobefnz: {  /* sweep objects to be finalized */
      sweepstep(L, g, GCSswpend, NULL, fast);
      stepresult = GCSWEEPMAX;
      break;
    }
    case GCSswpend: {  /* finish sweeps */
      checkSizes(L, g);
      g->gcstate = GCScallfin;
      stepresult = GCSWEEPMAX;
      break;
    }
    case GCScallfin: {  /* call finalizers */
      if (g->tobefnz && !g->gcemergency) {
        g->gcstopem = 0;  /* ok collections during finalizers */
        GCTM(L);  /* call one finalizer */
        stepresult = CWUFIN;
      }
      else {  /* emergency mode or no more finalizers */
        g->gcstate = GCSpause;  /* finish collection */
        stepresult = step2pause;
      }
      break;
    }
    default: lua_assert(0); return 0;
  }
  g->gcstopem = 0;
  return stepresult;
}